

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

SampledSpectrum
pbrt::G(Integrator *integrator,SamplerHandle sampler,Vertex *v0,Vertex *v1,
       SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  Normal3f *pNVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar12;
  undefined1 auVar13 [56];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  SampledSpectrum SVar22;
  RNG rng;
  RNG local_10;
  undefined1 auVar11 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [56];
  
  uVar1 = *(undefined8 *)
           &(v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])&v0->field_2,
                         ZEXT416((uint)(v0->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  uVar2 = *(undefined8 *)
           &(v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar17._0_8_ =
       CONCAT44(((float)((ulong)uVar1 >> 0x20) + auVar9._4_4_) * 0.5,
                ((float)uVar1 + auVar9._0_4_) * 0.5);
  auVar17._8_4_ = (auVar9._8_4_ + 0.0) * 0.5;
  auVar17._12_4_ = (auVar9._12_4_ + 0.0) * 0.5;
  fVar12 = ((v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
           (v0->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])&v1->field_2,
                         ZEXT416((uint)(v1->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  auVar14._0_8_ =
       CONCAT44(((float)((ulong)uVar2 >> 0x20) + auVar9._4_4_) * 0.5,
                ((float)uVar2 + auVar9._0_4_) * 0.5);
  auVar14._8_4_ = (auVar9._8_4_ + 0.0) * 0.5;
  auVar14._12_4_ = (auVar9._12_4_ + 0.0) * 0.5;
  auVar16 = ZEXT856(auVar14._8_8_);
  auVar8 = vsubps_avx(auVar17,auVar14);
  fVar3 = ((v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
          (v1->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  auVar13 = (undefined1  [56])0x0;
  auVar9 = vmovshdup_avx(auVar8);
  fVar18 = auVar9._0_4_;
  fVar4 = fVar12 - fVar3;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar18)),auVar8,auVar8);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar21 = 1.0 / auVar9._0_4_;
  fVar10 = (v0->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar9 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
  fVar19 = auVar9._0_4_;
  fVar4 = fVar4 * fVar19;
  auVar9 = ZEXT416((uint)(auVar8._0_4_ * fVar19));
  if (((((fVar10 != 0.0) || (NAN(fVar10))) ||
       (fVar10 = (v0->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y,
       fVar10 != 0.0)) ||
      ((NAN(fVar10) ||
       (fVar10 = (v0->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z,
       fVar10 != 0.0)))) || (NAN(fVar10))) {
    pNVar5 = &(v0->field_2).ei.super_Interaction.n;
    if (v0->type == Surface) {
      pNVar5 = (Normal3f *)((v0->field_2).mi.sigma_maj.values.values + 2);
    }
    fVar10 = (pNVar5->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar20 = ZEXT416((uint)(fVar4 * fVar10));
    auVar8 = vfmadd132ss_fma(ZEXT416((uint)(pNVar5->super_Tuple3<pbrt::Normal3,_float>).y),auVar20,
                             ZEXT416((uint)(fVar18 * fVar19)));
    auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar4),auVar20);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar20._0_4_)),auVar9,
                             ZEXT416((uint)(pNVar5->super_Tuple3<pbrt::Normal3,_float>).x));
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(auVar8,auVar20);
    fVar21 = fVar21 * auVar8._0_4_;
  }
  if ((((v1->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
      (fVar10 = (v1->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y,
      fVar10 != 0.0)) ||
     ((NAN(fVar10) ||
      ((fVar10 = (v1->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z,
       fVar10 != 0.0 || (NAN(fVar10))))))) {
    pNVar5 = &(v1->field_2).ei.super_Interaction.n;
    if (v1->type == Surface) {
      pNVar5 = (Normal3f *)((v1->field_2).mi.sigma_maj.values.values + 2);
    }
    fVar10 = (pNVar5->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar20 = ZEXT416((uint)(fVar4 * fVar10));
    auVar8 = vfmadd132ss_fma(ZEXT416((uint)(fVar18 * fVar19)),auVar20,
                             ZEXT416((uint)(pNVar5->super_Tuple3<pbrt::Normal3,_float>).y));
    auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar10),auVar20);
    auVar9 = vfmadd132ss_fma(auVar9,ZEXT416((uint)(auVar8._0_4_ + auVar20._0_4_)),
                             ZEXT416((uint)(pNVar5->super_Tuple3<pbrt::Normal3,_float>).x));
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(auVar9,auVar8);
    fVar21 = fVar21 * auVar9._0_4_;
  }
  uVar6 = auVar17._0_8_ * -0x395b586ca42e166b;
  uVar6 = (CONCAT44((int)(uVar6 >> 0x20),fVar12) ^
          ((uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b
          ) * -0x395b586ca42e166b;
  uVar6 = (uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b;
  uVar6 = uVar6 >> 0x2f ^ uVar6;
  uVar7 = (CONCAT44(0x4fb7dae8,fVar3) ^
          (((ulong)(auVar14._0_8_ * -0x395b586ca42e166b) >> 0x2f ^
           auVar14._0_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
          -0x395b586ca42e166b) * -0x395b586ca42e166b;
  uVar7 = (uVar7 >> 0x2f ^ uVar7) * -0x395b586ca42e166b;
  local_10.inc = uVar6 * 2 + 1;
  local_10.state =
       ((uVar7 >> 0x2f ^ uVar7) + 1) * 0x5851f42d4c957f2d + uVar6 * -0x4f5c17a566d501a4 + 1;
  SVar22 = Integrator::Tr(integrator,&(v0->field_2).ei.super_Interaction,
                          &(v1->field_2).ei.super_Interaction,lambda,&local_10);
  auVar15._0_8_ = SVar22.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar11._0_8_ = SVar22.values.values._0_8_;
  auVar11._8_56_ = auVar13;
  auVar9 = vmovlhps_avx(auVar11._0_16_,auVar15._0_16_);
  fVar10 = fVar21 * auVar9._0_4_;
  fVar12 = fVar21 * auVar9._4_4_;
  auVar9 = CONCAT412(fVar21 * auVar9._12_4_,CONCAT48(fVar21 * auVar9._8_4_,CONCAT44(fVar12,fVar10)))
  ;
  auVar9 = vshufpd_avx(auVar9,auVar9,1);
  SVar22.values.values._8_8_ = auVar9._0_8_;
  SVar22.values.values[0] = fVar10;
  SVar22.values.values[1] = fVar12;
  return (SampledSpectrum)SVar22.values.values;
}

Assistant:

PBRT_CPU_GPU
    Float Midpoint() const { return (low + high) / 2; }